

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

void jpeg_make_d_derived_tbl(j_decompress_ptr cinfo,boolean isDC,int tblno,d_derived_tbl **pdtbl)

{
  jpeg_error_mgr *pjVar1;
  JHUFF_TBL *pJVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  d_derived_tbl *pdVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  char huffsize [257];
  uint huffcode [257];
  
  if (3 < (uint)tblno) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x34;
    (pjVar1->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pJVar2 = cinfo->dc_huff_tbl_ptrs[(ulong)(isDC == 0) * 4 + (long)tblno];
  if (pJVar2 == (JHUFF_TBL *)0x0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x34;
    (pjVar1->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pdVar6 = *pdtbl;
  if (pdVar6 == (d_derived_tbl *)0x0) {
    pdVar6 = (d_derived_tbl *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x620);
    *pdtbl = pdVar6;
  }
  pdVar6->pub = pJVar2;
  uVar7 = 0;
  lVar11 = 1;
  while( true ) {
    iVar4 = (int)uVar7;
    if (lVar11 == 0x11) break;
    bVar9 = pJVar2->bits[lVar11];
    if (0x100 < (int)(iVar4 + (uint)bVar9)) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 9;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    for (lVar8 = 0; (uint)bVar9 != (uint)lVar8; lVar8 = lVar8 + 1) {
      huffsize[lVar8 + iVar4] = (char)lVar11;
    }
    uVar7 = (ulong)(iVar4 + (uint)lVar8);
    lVar11 = lVar11 + 1;
  }
  huffsize[iVar4] = '\0';
  iVar10 = (int)huffsize[0];
  lVar11 = 1;
  lVar8 = 0;
  uVar5 = 0;
  while (huffsize[0] != '\0') {
    lVar12 = lVar8 << 0x20;
    lVar8 = (long)(int)lVar8;
    uVar14 = uVar5 * 2;
    while (iVar10 == huffsize[0]) {
      huffcode[lVar8] = uVar5;
      lVar3 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      uVar5 = uVar5 + 1;
      lVar12 = lVar12 + 0x100000000;
      uVar14 = uVar14 + 2;
      huffsize[0] = huffsize[lVar3];
    }
    if (1L << ((byte)iVar10 & 0x3f) <= (long)(ulong)uVar5) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 9;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    iVar10 = iVar10 + 1;
    uVar5 = uVar14;
    huffsize[0] = huffsize[lVar12 >> 0x20];
  }
  lVar12 = 0;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    uVar13 = 0xffffffffffffffff;
    if (pJVar2->bits[lVar8 + 1] != '\0') {
      lVar12 = (long)(int)lVar12;
      pdVar6->valoffset[lVar8 + 1] = lVar12 - (ulong)huffcode[lVar12];
      lVar12 = (ulong)pJVar2->bits[lVar8 + 1] + lVar12;
      uVar13 = (ulong)huffcode[lVar12 + -1];
    }
    pdVar6->maxcode[lVar8 + 1] = uVar13;
  }
  pdVar6->maxcode[0x11] = 0xfffff;
  lVar8 = 0;
  memset(pdVar6->look_nbits,0,0x400);
  for (; lVar11 != 9; lVar11 = lVar11 + 1) {
    bVar9 = 8 - (char)lVar11;
    lVar8 = (long)(int)lVar8;
    for (uVar5 = 1; uVar5 <= pJVar2->bits[lVar11]; uVar5 = uVar5 + 1) {
      lVar12 = (long)(int)(huffcode[lVar8] << (bVar9 & 0x1f));
      for (iVar10 = 1 << (bVar9 & 0x1f); 0 < iVar10; iVar10 = iVar10 + -1) {
        pdVar6->look_nbits[lVar12] = (int)lVar11;
        pdVar6->look_sym[lVar12] = pJVar2->huffval[lVar8];
        lVar12 = lVar12 + 1;
      }
      lVar8 = lVar8 + 1;
    }
  }
  if (isDC != 0) {
    uVar13 = 0;
    if (iVar4 < 1) {
      uVar7 = uVar13;
    }
    for (; uVar7 != uVar13; uVar13 = uVar13 + 1) {
      if (0xf < pJVar2->huffval[uVar13]) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 9;
        (*pjVar1->error_exit)((j_common_ptr)cinfo);
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
jpeg_make_d_derived_tbl (j_decompress_ptr cinfo, boolean isDC, int tblno,
			 d_derived_tbl ** pdtbl)
{
  JHUFF_TBL *htbl;
  d_derived_tbl *dtbl;
  int p, i, l, si, numsymbols;
  int lookbits, ctr;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (d_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(d_derived_tbl));
  dtbl = *pdtbl;
  dtbl->pub = htbl;		/* fill in back link */
  
  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int) htbl->bits[l];
    if (i < 0 || p + i > 256)	/* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char) l;
  }
  huffsize[p] = 0;
  numsymbols = p;
  
  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */
  
  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int) huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((INT32) code) >= (((INT32) 1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }

  /* Figure F.15: generate decoding tables for bit-sequential decoding */

  p = 0;
  for (l = 1; l <= 16; l++) {
    if (htbl->bits[l]) {
      /* valoffset[l] = huffval[] index of 1st symbol of code length l,
       * minus the minimum code of length l
       */
      dtbl->valoffset[l] = (INT32) p - (INT32) huffcode[p];
      p += htbl->bits[l];
      dtbl->maxcode[l] = huffcode[p-1]; /* maximum code of length l */
    } else {
      dtbl->maxcode[l] = -1;	/* -1 if no codes of this length */
    }
  }
  dtbl->maxcode[17] = 0xFFFFFL; /* ensures jpeg_huff_decode terminates */

  /* Compute lookahead tables to speed up decoding.
   * First we set all the table entries to 0, indicating "too long";
   * then we iterate through the Huffman codes that are short enough and
   * fill in all the entries that correspond to bit sequences starting
   * with that code.
   */

  MEMZERO(dtbl->look_nbits, SIZEOF(dtbl->look_nbits));

  p = 0;
  for (l = 1; l <= HUFF_LOOKAHEAD; l++) {
    for (i = 1; i <= (int) htbl->bits[l]; i++, p++) {
      /* l = current code's length, p = its index in huffcode[] & huffval[]. */
      /* Generate left-justified code followed by all possible bit sequences */
      lookbits = huffcode[p] << (HUFF_LOOKAHEAD-l);
      for (ctr = 1 << (HUFF_LOOKAHEAD-l); ctr > 0; ctr--) {
	dtbl->look_nbits[lookbits] = l;
	dtbl->look_sym[lookbits] = htbl->huffval[p];
	lookbits++;
      }
    }
  }

  /* Validate symbols as being reasonable.
   * For AC tables, we make no check, but accept all byte values 0..255.
   * For DC tables, we require the symbols to be in range 0..15.
   * (Tighter bounds could be applied depending on the data depth and mode,
   * but this is sufficient to ensure safe decoding.)
   */
  if (isDC) {
    for (i = 0; i < numsymbols; i++) {
      int sym = htbl->huffval[i];
      if (sym < 0 || sym > 15)
	ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    }
  }
}